

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O3

void __thiscall QTextHtmlExporter::emitFontFamily(QTextHtmlExporter *this,QStringList *families)

{
  qsizetype qVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  QString *family;
  QString *pQVar5;
  long in_FS_OFFSET;
  QLatin1String QVar6;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QLatin1String QVar9;
  QStringView local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar6.m_data = (char *)0xd;
  QVar6.m_size = (qsizetype)this;
  QString::append(QVar6);
  lVar4 = (families->d).size;
  if (lVar4 != 0) {
    pQVar5 = (families->d).ptr;
    lVar4 = lVar4 * 0x18;
    bVar2 = true;
    do {
      local_50.m_data = (pQVar5->d).ptr;
      local_50.m_size = (pQVar5->d).size;
      qVar1 = QStringView::indexOf(&local_50,(QChar)0x27,0,CaseSensitive);
      if (!bVar2) {
        QVar7.m_data = (char *)0x1;
        QVar7.m_size = (qsizetype)this;
        QString::append(QVar7);
      }
      pcVar3 = (char *)((ulong)(qVar1 != -1) * 5 + 1);
      QVar8.m_data = pcVar3;
      QVar8.m_size = (qsizetype)this;
      QString::append(QVar8);
      QString::toHtmlEscaped();
      QString::append((QString *)this);
      if ((QArrayData *)local_50.m_size != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_50.m_size)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_50.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_50.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_50.m_size,2,0x10);
        }
      }
      QVar9.m_data = pcVar3;
      QVar9.m_size = (qsizetype)this;
      QString::append(QVar9);
      pQVar5 = pQVar5 + 1;
      bVar2 = false;
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != 0);
  }
  QString::append((QChar)(char16_t)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextHtmlExporter::emitFontFamily(const QStringList &families)
{
    html += " font-family:"_L1;

    bool first = true;
    for (const QString &family : families) {
        auto quote = "\'"_L1;
        if (family.contains(u'\''))
            quote = "&quot;"_L1;

        if (!first)
            html += ","_L1;
        else
            first = false;
        html += quote;
        html += family.toHtmlEscaped();
        html += quote;
    }
    html += u';';
}